

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::CopyRTShaderGroupNames
               (unordered_map<Diligent::HashMapStringKey,_unsigned_int,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>_>
                *NameToGroupIndex,RayTracingPipelineStateCreateInfo *CreateInfo,
               FixedLinearAllocator *MemPool)

{
  RayTracingPipelineStateCreateInfo *pRVar1;
  Char *pCVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false,_false>,_bool>
  pVar3;
  undefined1 local_190 [8];
  string msg_3;
  string msg_2;
  uint local_13c;
  HashMapStringKey local_138;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false> local_128;
  byte local_120;
  byte local_111;
  char *pcStack_110;
  bool IsNewName_2;
  char *Name_2;
  undefined1 local_100 [4];
  Uint32 i_2;
  string msg_1;
  uint local_cc;
  HashMapStringKey local_c8;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false> local_b8;
  byte local_b0;
  byte local_a1;
  char *pcStack_a0;
  bool IsNewName_1;
  char *Name_1;
  undefined1 local_90 [4];
  Uint32 i_1;
  string msg;
  uint local_5c;
  HashMapStringKey local_58;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false> local_48;
  byte local_40;
  byte local_31;
  char *pcStack_30;
  bool IsNewName;
  char *Name;
  Uint32 i;
  Uint32 GroupIndex;
  FixedLinearAllocator *MemPool_local;
  RayTracingPipelineStateCreateInfo *CreateInfo_local;
  unordered_map<Diligent::HashMapStringKey,_unsigned_int,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>_>
  *NameToGroupIndex_local;
  
  Name._4_4_ = 0;
  _i = MemPool;
  MemPool_local = (FixedLinearAllocator *)CreateInfo;
  CreateInfo_local = (RayTracingPipelineStateCreateInfo *)NameToGroupIndex;
  for (Name._0_4_ = 0; pRVar1 = CreateInfo_local,
      (uint)Name < *(uint *)&MemPool_local[1].m_pAllocator; Name._0_4_ = (uint)Name + 1) {
    pcStack_30 = *(char **)(MemPool_local[1].m_CurrAlignment + (ulong)(uint)Name * 0x10);
    pCVar2 = FixedLinearAllocator::CopyString(_i,pcStack_30,0);
    HashMapStringKey::HashMapStringKey(&local_58,pCVar2,false);
    local_5c = Name._4_4_;
    Name._4_4_ = Name._4_4_ + 1;
    pVar3 = std::
            unordered_map<Diligent::HashMapStringKey,unsigned_int,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>>
            ::emplace<Diligent::HashMapStringKey,unsigned_int>
                      ((unordered_map<Diligent::HashMapStringKey,unsigned_int,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>>
                        *)pRVar1,&local_58,&local_5c);
    msg.field_2._8_8_ =
         pVar3.first.
         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>
         ._M_cur;
    local_48._M_cur = (__node_type *)msg.field_2._8_8_;
    local_40 = pVar3.second;
    HashMapStringKey::~HashMapStringKey(&local_58);
    local_31 = pVar3.second & 1;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[100]>
                ((string *)local_90,
                 (char (*) [100])
                 "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should\'ve caught this error."
                );
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CopyRTShaderGroupNames",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x32e);
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  for (Name_1._4_4_ = 0; pRVar1 = CreateInfo_local,
      Name_1._4_4_ <
      *(uint *)&MemPool_local[1].m_DbgAllocations.
                super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; Name_1._4_4_ = Name_1._4_4_ + 1) {
    pcStack_a0 = *(char **)(MemPool_local[1].m_DbgCurrAllocation + (ulong)Name_1._4_4_ * 0x18);
    pCVar2 = FixedLinearAllocator::CopyString(_i,pcStack_a0,0);
    HashMapStringKey::HashMapStringKey(&local_c8,pCVar2,false);
    local_cc = Name._4_4_;
    Name._4_4_ = Name._4_4_ + 1;
    pVar3 = std::
            unordered_map<Diligent::HashMapStringKey,unsigned_int,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>>
            ::emplace<Diligent::HashMapStringKey,unsigned_int>
                      ((unordered_map<Diligent::HashMapStringKey,unsigned_int,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>>
                        *)pRVar1,&local_c8,&local_cc);
    msg_1.field_2._8_8_ =
         pVar3.first.
         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>
         ._M_cur;
    local_b8._M_cur = (__node_type *)msg_1.field_2._8_8_;
    local_b0 = pVar3.second;
    HashMapStringKey::~HashMapStringKey(&local_c8);
    local_a1 = pVar3.second & 1;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[100]>
                ((string *)local_100,
                 (char (*) [100])
                 "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should\'ve caught this error."
                );
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CopyRTShaderGroupNames",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x334);
      std::__cxx11::string::~string((string *)local_100);
    }
  }
  for (Name_2._4_4_ = 0; pRVar1 = CreateInfo_local,
      Name_2._4_4_ <
      *(uint *)&MemPool_local[1].m_DbgAllocations.
                super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage; Name_2._4_4_ = Name_2._4_4_ + 1)
  {
    pcStack_110 = *(char **)((long)MemPool_local[1].m_DbgAllocations.
                                   super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_finish +
                            (ulong)Name_2._4_4_ * 0x20);
    pCVar2 = FixedLinearAllocator::CopyString(_i,pcStack_110,0);
    HashMapStringKey::HashMapStringKey(&local_138,pCVar2,false);
    local_13c = Name._4_4_;
    Name._4_4_ = Name._4_4_ + 1;
    pVar3 = std::
            unordered_map<Diligent::HashMapStringKey,unsigned_int,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>>
            ::emplace<Diligent::HashMapStringKey,unsigned_int>
                      ((unordered_map<Diligent::HashMapStringKey,unsigned_int,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>>
                        *)pRVar1,&local_138,&local_13c);
    local_128._M_cur =
         (__node_type *)
         pVar3.first.
         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>
         ._M_cur;
    local_120 = pVar3.second;
    HashMapStringKey::~HashMapStringKey(&local_138);
    local_111 = pVar3.second & 1;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      FormatString<char[100]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (char (*) [100])
                 "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should\'ve caught this error."
                );
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CopyRTShaderGroupNames",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x33a);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
  }
  if (*(int *)&MemPool_local[1].m_pAllocator +
      *(int *)&MemPool_local[1].m_DbgAllocations.
               super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
               ._M_impl.super__Vector_impl_data._M_start +
      *(int *)&MemPool_local[1].m_DbgAllocations.
               super__Vector_base<Diligent::FixedLinearAllocator::DbgAllocationInfo,_std::allocator<Diligent::FixedLinearAllocator::DbgAllocationInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage != Name._4_4_) {
    FormatString<char[26],char[118]>
              ((string *)local_190,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "CreateInfo.GeneralShaderCount + CreateInfo.TriangleHitShaderCount + CreateInfo.ProceduralHitShaderCount == GroupIndex"
               ,(char (*) [118])MemPool_local);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CopyRTShaderGroupNames",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x33d);
    std::__cxx11::string::~string((string *)local_190);
  }
  return;
}

Assistant:

void CopyRTShaderGroupNames(std::unordered_map<HashMapStringKey, Uint32>& NameToGroupIndex,
                            const RayTracingPipelineStateCreateInfo&      CreateInfo,
                            FixedLinearAllocator&                         MemPool) noexcept
{
    Uint32 GroupIndex = 0;

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        const char* Name      = CreateInfo.pGeneralShaders[i].Name;
        const bool  IsNewName = NameToGroupIndex.emplace(HashMapStringKey{MemPool.CopyString(Name)}, GroupIndex++).second;
        VERIFY(IsNewName, "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should've caught this error.");
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        const char* Name      = CreateInfo.pTriangleHitShaders[i].Name;
        const bool  IsNewName = NameToGroupIndex.emplace(HashMapStringKey{MemPool.CopyString(Name)}, GroupIndex++).second;
        VERIFY(IsNewName, "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should've caught this error.");
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        const char* Name      = CreateInfo.pProceduralHitShaders[i].Name;
        const bool  IsNewName = NameToGroupIndex.emplace(HashMapStringKey{MemPool.CopyString(Name)}, GroupIndex++).second;
        VERIFY(IsNewName, "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should've caught this error.");
    }

    VERIFY_EXPR(CreateInfo.GeneralShaderCount + CreateInfo.TriangleHitShaderCount + CreateInfo.ProceduralHitShaderCount == GroupIndex);
}